

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  undefined4 in_stack_00000018;
  ImGuiWindowSettings *local_20;
  
  local_20 = ImChunkStream<ImGuiWindowSettings>::begin(&GImGui->SettingsWindows);
  while( true ) {
    if (local_20 == (ImGuiWindowSettings *)0x0) {
      return (ImGuiWindowSettings *)0x0;
    }
    if (local_20->ID == in_EDI) break;
    local_20 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                         ((ImChunkStream<ImGuiWindowSettings> *)CONCAT44(id,in_stack_00000018),
                          (ImGuiWindowSettings *)g);
  }
  return local_20;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->ID == id)
            return settings;
    return NULL;
}